

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O2

int CVBBDPrecReInit(void *cvode_mem,sunindextype mudq,sunindextype mldq,sunrealtype dqrely)

{
  double __x;
  long *plVar1;
  long lVar2;
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    line = 0x13a;
  }
  else if (*(long *)((long)cvode_mem + 0x410) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    error_code = -2;
    line = 0x143;
  }
  else {
    plVar1 = *(long **)(*(long *)((long)cvode_mem + 0x410) + 0xf0);
    if (plVar1 != (long *)0x0) {
      lVar2 = plVar1[0xf];
      if (mudq < 1) {
        mudq = 0;
      }
      if (lVar2 <= mudq) {
        mudq = lVar2 + -1;
      }
      if (mldq < 1) {
        mldq = 0;
      }
      *plVar1 = mudq;
      if (lVar2 <= mldq) {
        mldq = lVar2 + -1;
      }
      plVar1[1] = mldq;
      if (dqrely <= 0.0) {
        __x = *(double *)((long)cvode_mem + 8);
        dqrely = 0.0;
        if (0.0 < __x) {
          if (__x < 0.0) {
            dqrely = sqrt(__x);
          }
          else {
            dqrely = SQRT(__x);
          }
        }
      }
      plVar1[4] = (long)dqrely;
      plVar1[0x12] = 0;
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. CVBBDPrecInit must be called.";
    error_code = -5;
    line = 0x14c;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVBBDPrecReInit",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVBBDPrecReInit(void* cvode_mem, sunindextype mudq, sunindextype mldq,
                    sunrealtype dqrely)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;
  sunindextype Nlocal;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if the LS linear solver interface has been created */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Test if the preconditioner data is non-NULL */
  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBBDPrecData)cvls_mem->P_data;

  /* Load half-bandwidths */
  Nlocal      = pdata->n_local;
  pdata->mudq = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));

  /* Set pdata->dqrely based on input dqrely (0 implies default). */
  pdata->dqrely = (dqrely > ZERO) ? dqrely : SUNRsqrt(cv_mem->cv_uround);

  /* Re-initialize nge */
  pdata->nge = 0;

  return (CVLS_SUCCESS);
}